

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O2

int duckdb_hll::hllMerge(uint8_t *max,robj *hll)

{
  sds s;
  size_t sVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  uint8_t *p;
  byte *pbVar9;
  
  s = (sds)hll->ptr;
  if (s[4] == '\0') {
    for (uVar2 = 0; uVar2 != 0x6000; uVar2 = uVar2 + 6) {
      uVar4 = uVar2 >> 3 & 0x1fffffff;
      bVar5 = (byte)(CONCAT11(s[uVar4 + 0x12],s[uVar4 + 0x11]) >> ((byte)uVar2 & 7)) & 0x3f;
      if (*max < bVar5) {
        *max = bVar5;
      }
      max = max + 1;
    }
  }
  else {
    sVar1 = sdslen(s);
    iVar3 = 0;
    for (pbVar9 = (byte *)(s + 0x11); pbVar9 < s + sVar1; pbVar9 = pbVar9 + lVar7) {
      bVar5 = *pbVar9;
      if ((bVar5 & 0xffffffc0) == 0x40) {
        iVar3 = iVar3 + (bVar5 & 0x3f) * 0x100 + (uint)pbVar9[1] + 1;
        lVar7 = 2;
      }
      else {
        lVar7 = 1;
        if ((bVar5 & 0xc0) == 0) {
          iVar3 = iVar3 + (uint)bVar5 + 1;
        }
        else {
          bVar6 = bVar5 >> 2 & 0x1f;
          for (lVar8 = 0; (ulong)(bVar5 & 3) + 1 != lVar8; lVar8 = lVar8 + 1) {
            if (max[lVar8 + iVar3] <= bVar6) {
              max[lVar8 + iVar3] = bVar6 + 1;
            }
          }
          iVar3 = iVar3 + (int)lVar8;
        }
      }
    }
    if (iVar3 != 0x1000) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int hllMerge(uint8_t *max, robj *hll) {
    struct hllhdr *hdr = (struct hllhdr *) hll->ptr;
    int i;

    if (hdr->encoding == HLL_DENSE) {
        uint8_t val;

        for (i = 0; i < HLL_REGISTERS; i++) {
            HLL_DENSE_GET_REGISTER(val,hdr->registers + 1,i);
            if (val > max[i]) max[i] = val;
        }
    } else {
        uint8_t *p = (uint8_t *) hll->ptr, *end = p + sdslen((sds) hll->ptr);
        long runlen, regval;

        p += HLL_HDR_SIZE;
        i = 0;
        while(p < end) {
            if (HLL_SPARSE_IS_ZERO(p)) {
                runlen = HLL_SPARSE_ZERO_LEN(p);
                i += runlen;
                p++;
            } else if (HLL_SPARSE_IS_XZERO(p)) {
                runlen = HLL_SPARSE_XZERO_LEN(p);
                i += runlen;
                p += 2;
            } else {
                runlen = HLL_SPARSE_VAL_LEN(p);
                regval = HLL_SPARSE_VAL_VALUE(p);
                while(runlen--) {
                    if (regval > max[i]) max[i] = regval;
                    i++;
                }
                p++;
            }
        }
        if (i != HLL_REGISTERS) return HLL_C_ERR;
    }
    return HLL_C_OK;
}